

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab3_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  ostream local_260 [8];
  ofstream out;
  undefined1 local_60 [8];
  Interpreter i;
  
  if (argc < 3) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage infile outfile.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::ofstream::ofstream(local_260);
    std::ofstream::open((char *)local_260,(_Ios_Openmode)argv[2]);
    Interpreter::Interpreter((Interpreter *)local_60);
    Interpreter::run((Interpreter *)local_60,argv[1],local_260,PROJ5);
    DatalogDatabase::~DatalogDatabase((DatalogDatabase *)local_60);
    std::ofstream::~ofstream(local_260);
  }
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
  if (argc < 3)
  {
    cout << "Usage infile outfile." << endl;
    return 0;
  }

  ofstream out;
  out.open(argv[2]);

  Interpreter i = Interpreter();
  i.run(argv[1], out, PROJ5);
}